

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<DomSpacer_const*,QString>::emplace_helper<QString_const&>
          (QHash<DomSpacer_const*,QString> *this,DomSpacer **key,QString *args)

{
  Data *pDVar1;
  piter pVar2;
  Node<DomSpacer_const*,QString> *this_00;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<DomSpacer_const*,QString>>::findOrInsert<DomSpacer_const*>
            ((InsertionResult *)local_38,
             *(Data<QHashPrivate::Node<DomSpacer_const*,QString>> **)this,key);
  this_00 = (Node<DomSpacer_const*,QString> *)
            ((*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries +
            (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
            [(uint)local_38._8_8_ & 0x7f]);
  if (local_38[0x10] == false) {
    *(DomSpacer **)this_00 = *key;
    pDVar1 = (args->d).d;
    *(Data **)(this_00 + 8) = pDVar1;
    *(char16_t **)(this_00 + 0x10) = (args->d).ptr;
    *(qsizetype *)(this_00 + 0x18) = (args->d).size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    QHashPrivate::Node<DomSpacer_const*,QString>::emplaceValue<QString_const&>(this_00,args);
  }
  pVar2.bucket = local_38._8_8_;
  pVar2.d = (Data<QHashPrivate::Node<const_DomSpacer_*,_QString>_> *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }